

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

void call_handler(JSContext *ctx,JSValue func)

{
  JSValue v;
  JSValue func_obj;
  JSValue v_00;
  JSValue v_01;
  int iVar1;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  JSValue JVar2;
  JSValue *unaff_retaddr;
  JSValue func1;
  JSValue ret;
  JSContext *in_stack_ffffffffffffff90;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff9c;
  JSContext *ctx_00;
  undefined8 local_58;
  undefined8 local_50;
  JSValueUnion in_stack_ffffffffffffffd8;
  int64_t in_stack_ffffffffffffffe0;
  
  v_01.tag = in_RDX;
  v_01.u.float64 = in_RSI.float64;
  JVar2 = JS_DupValue(in_RDI,v_01);
  uVar3 = 0;
  ctx_00 = (JSContext *)0x3;
  func_obj.tag = in_stack_ffffffffffffffe0;
  func_obj.u.float64 = in_stack_ffffffffffffffd8.float64;
  JVar2 = JS_Call((JSContext *)JVar2.tag,func_obj,JVar2,JVar2.u._4_4_,unaff_retaddr);
  local_58 = JVar2.u;
  local_50 = JVar2.tag;
  JVar2.u._4_4_ = in_stack_ffffffffffffff9c;
  JVar2.u.int32 = uVar3;
  JVar2.tag = (int64_t)ctx_00;
  JS_FreeValue(in_stack_ffffffffffffff90,JVar2);
  v_00.tag = local_50;
  v_00.u.float64 = local_58;
  iVar1 = JS_IsException(v_00);
  if (iVar1 != 0) {
    js_std_dump_error(ctx_00);
  }
  v.u._4_4_ = in_stack_ffffffffffffff9c;
  v.u.int32 = uVar3;
  v.tag = (int64_t)ctx_00;
  JS_FreeValue(in_stack_ffffffffffffff90,v);
  return;
}

Assistant:

static void call_handler(JSContext *ctx, JSValueConst func)
{
    JSValue ret, func1;
    /* 'func' might be destroyed when calling itself (if it frees the
       handler), so must take extra care */
    func1 = JS_DupValue(ctx, func);
    ret = JS_Call(ctx, func1, JS_UNDEFINED, 0, NULL);
    JS_FreeValue(ctx, func1);
    if (JS_IsException(ret))
        js_std_dump_error(ctx);
    JS_FreeValue(ctx, ret);
}